

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcXsim.c
# Opt level: O2

void Abc_XsimPrint(FILE *pFile,int Value)

{
  if (Value - 1U < 3) {
    fputc(*(int *)(&DAT_007af2fc + (ulong)(Value - 1U) * 4),(FILE *)pFile);
    return;
  }
  __assert_fail("Value == XVSX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcXsim.c"
                ,0x5c,"void Abc_XsimPrint(FILE *, int)");
}

Assistant:

static inline void Abc_XsimPrint( FILE * pFile, int Value )   
{ 
    if ( Value == XVS0 )
    {
        fprintf( pFile, "0" );
        return;
    }
    if ( Value == XVS1 )
    {
        fprintf( pFile, "1" );
        return;
    }
    assert( Value == XVSX );       
    fprintf( pFile, "x" );
}